

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  ValueType VVar5;
  ulong uVar6;
  char *pcVar7;
  pointer pPVar8;
  long lVar9;
  _Base_ptr in_RSI;
  int in_EDI;
  int ret;
  int poly_att_id;
  unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_> expert_encoder;
  bool input_is_mesh;
  Encoder encoder;
  int speed;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> maybe_pc;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> maybe_mesh;
  Options load_options;
  Mesh *mesh;
  unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> pc;
  int i;
  int argc_check;
  Options options;
  int in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  ExpertEncoder *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  type in_stack_fffffffffffffa20;
  PointCloud *in_stack_fffffffffffffa28;
  char *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  allocator<char> *in_stack_fffffffffffffa40;
  allocator<char> *__a;
  string *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  void *in_stack_fffffffffffffa70;
  ExpertEncoder *in_stack_fffffffffffffa78;
  bool local_579;
  PointCloud *in_stack_fffffffffffffa90;
  pointer in_stack_fffffffffffffa98;
  ExpertEncoder *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  uint in_stack_fffffffffffffac4;
  int32_t in_stack_fffffffffffffac8;
  int32_t in_stack_fffffffffffffacc;
  string *in_stack_fffffffffffffad0;
  Mesh *in_stack_fffffffffffffad8;
  int local_43c;
  allocator<char> local_409;
  string local_408 [39];
  undefined1 local_3e1 [37];
  int local_3bc;
  bool local_319;
  string local_318 [204];
  int local_24c;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> local_248;
  string *in_stack_fffffffffffffdf8;
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [80];
  pointer local_168;
  undefined1 local_160 [16];
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  uint local_90;
  int local_80;
  int local_7c;
  byte local_78;
  int local_74;
  int local_70;
  byte local_6c;
  int local_68;
  byte local_64;
  int local_60;
  byte local_5c;
  int local_58;
  undefined1 local_54;
  undefined1 local_53;
  string local_50 [32];
  _Base_ptr local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  anon_unknown.dwarf_8bad::Options::Options((Options *)in_stack_fffffffffffffa10);
  local_7c = local_8 + -1;
  local_80 = 1;
  do {
    if (local_8 <= local_80) {
      if ((local_8 < 3) || (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
        anon_unknown.dwarf_8bad::Usage();
        local_4 = -1;
        local_90 = 1;
      }
      else {
        std::unique_ptr<draco::PointCloud,std::default_delete<draco::PointCloud>>::
        unique_ptr<std::default_delete<draco::PointCloud>,void>
                  ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                   in_stack_fffffffffffffa10);
        local_168 = (pointer)0x0;
        if ((local_78 & 1) == 0) {
          draco::Options::Options((Options *)0x11151c);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                     in_stack_fffffffffffffa40);
          draco::Options::SetBool
                    ((Options *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                     SUB81((ulong)in_stack_fffffffffffffa40 >> 0x38,0));
          std::__cxx11::string::~string(local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                     in_stack_fffffffffffffa40);
          draco::Options::SetBool
                    ((Options *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                     SUB81((ulong)in_stack_fffffffffffffa40 >> 0x38,0));
          std::__cxx11::string::~string(local_1e0);
          std::allocator<char>::~allocator(&local_1e1);
          draco::ReadMeshFromFile
                    ((string *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     (Options *)in_stack_fffffffffffffa10);
          bVar1 = draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
                  ::ok((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
                       )0x111626);
          if (bVar1) {
            draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::value
                      ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
                       )&stack0xfffffffffffffde8);
            local_168 = std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
                                  ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                                   in_stack_fffffffffffffa10);
            draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::value
                      ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
                       )&stack0xfffffffffffffde8);
            std::unique_ptr<draco::PointCloud,std::default_delete<draco::PointCloud>>::operator=
                      ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                       in_stack_fffffffffffffa20,
                       (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                       CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
          }
          else {
            draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::
            status((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                   &stack0xfffffffffffffde8);
            pcVar7 = draco::Status::error_msg((Status *)0x111664);
            printf("Failed loading the input mesh: %s.\n",pcVar7);
            local_4 = -1;
          }
          local_90 = (uint)!bVar1;
          draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::
          ~StatusOr((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                    in_stack_fffffffffffffa10);
          draco::Options::~Options((Options *)0x1117ef);
        }
        else {
          draco::ReadPointCloudFromFile(in_stack_fffffffffffffdf8);
          bVar1 = draco::
                  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                  ::ok((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                        *)0x11183b);
          if (bVar1) {
            draco::
            StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
            value(&local_248);
            std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::operator=
                      ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                       in_stack_fffffffffffffa10,
                       (unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
          }
          else {
            draco::
            StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
            status(&local_248);
            pcVar7 = draco::Status::error_msg((Status *)0x111879);
            printf("Failed loading the input point cloud: %s.\n",pcVar7);
            local_4 = -1;
          }
          local_90 = (uint)!bVar1;
          draco::
          StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
          ~StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                     *)in_stack_fffffffffffffa10);
        }
        if (local_90 == 0) {
          if (local_74 < 0) {
            printf("Error: Position attribute cannot be skipped.\n");
            local_4 = -1;
            local_90 = 1;
          }
          else {
            if (local_70 < 0) {
              std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
              operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                         0x111999);
              iVar3 = draco::PointCloud::NumNamedAttributes
                                ((PointCloud *)
                                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                 (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
              if (0 < iVar3) {
                local_6c = 1;
              }
              while( true ) {
                std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *
                           )0x1119d2);
                iVar3 = draco::PointCloud::NumNamedAttributes
                                  ((PointCloud *)
                                   CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                   (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
                if (iVar3 < 1) break;
                in_stack_fffffffffffffad0 = (string *)local_160;
                in_stack_fffffffffffffad8 =
                     (Mesh *)std::
                             unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                             ::operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                                           *)0x111a09);
                std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *
                           )0x111a1e);
                uVar4 = draco::PointCloud::GetNamedAttributeId
                                  ((PointCloud *)
                                   CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                   (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                                   (int)in_stack_fffffffffffffa10);
                (*(in_stack_fffffffffffffad8->super_PointCloud)._vptr_PointCloud[3])
                          (in_stack_fffffffffffffad8,(ulong)uVar4);
              }
            }
            if (local_68 < 0) {
              std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
              operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                         0x111a72);
              in_stack_fffffffffffffacc =
                   draco::PointCloud::NumNamedAttributes
                             ((PointCloud *)
                              CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                              (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
              if (0 < in_stack_fffffffffffffacc) {
                local_64 = 1;
              }
              while( true ) {
                std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *
                           )0x111aab);
                in_stack_fffffffffffffac8 =
                     draco::PointCloud::NumNamedAttributes
                               ((PointCloud *)
                                CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
                if (in_stack_fffffffffffffac8 < 1) break;
                in_stack_fffffffffffffab8 =
                     (ExpertEncoder *)
                     std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                     operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                                 *)0x111ae2);
                std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *
                           )0x111af7);
                in_stack_fffffffffffffac4 =
                     draco::PointCloud::GetNamedAttributeId
                               ((PointCloud *)
                                CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                                (int)in_stack_fffffffffffffa10);
                (*(in_stack_fffffffffffffab8->super_EncoderBase<draco::EncoderOptionsBase<int>_>).
                  _vptr_EncoderBase[3])(in_stack_fffffffffffffab8,(ulong)in_stack_fffffffffffffac4);
              }
            }
            if (local_60 < 0) {
              std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
              operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                         0x111b4b);
              iVar3 = draco::PointCloud::NumNamedAttributes
                                ((PointCloud *)
                                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                 (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
              if (0 < iVar3) {
                local_5c = 1;
              }
              while( true ) {
                std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *
                           )0x111b84);
                iVar3 = draco::PointCloud::NumNamedAttributes
                                  ((PointCloud *)
                                   CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                   (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
                if (iVar3 < 1) break;
                in_stack_fffffffffffffa90 = (PointCloud *)local_160;
                in_stack_fffffffffffffa98 =
                     std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                     operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                                 *)0x111bbb);
                std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *
                           )0x111bd0);
                uVar4 = draco::PointCloud::GetNamedAttributeId
                                  ((PointCloud *)
                                   CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                   (Type)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                                   (int)in_stack_fffffffffffffa10);
                (*in_stack_fffffffffffffa98->_vptr_PointCloud[3])
                          (in_stack_fffffffffffffa98,(ulong)uVar4);
              }
            }
            if ((((local_6c & 1) != 0) || ((local_64 & 1) != 0)) || ((local_5c & 1) != 0)) {
              pPVar8 = std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                       operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                                   *)0x111c34);
              (*pPVar8->_vptr_PointCloud[5])();
            }
            local_24c = 10 - local_58;
            draco::Encoder::Encoder((Encoder *)in_stack_fffffffffffffa10);
            if (0 < local_74) {
              draco::Encoder::SetAttributeQuantization
                        ((Encoder *)in_stack_fffffffffffffa50,
                         (Type)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                         (int)in_stack_fffffffffffffa48);
            }
            if (0 < local_70) {
              draco::Encoder::SetAttributeQuantization
                        ((Encoder *)in_stack_fffffffffffffa50,
                         (Type)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                         (int)in_stack_fffffffffffffa48);
            }
            if (0 < local_68) {
              draco::Encoder::SetAttributeQuantization
                        ((Encoder *)in_stack_fffffffffffffa50,
                         (Type)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                         (int)in_stack_fffffffffffffa48);
            }
            if (0 < local_60) {
              draco::Encoder::SetAttributeQuantization
                        ((Encoder *)in_stack_fffffffffffffa50,
                         (Type)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                         (int)in_stack_fffffffffffffa48);
            }
            draco::Encoder::SetSpeedOptions
                      ((Encoder *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                       in_stack_fffffffffffffa08);
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) != 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                             in_stack_fffffffffffffa30);
              std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,local_318);
              std::__cxx11::string::~string(local_318);
            }
            std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::operator*
                      ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                       in_stack_fffffffffffffa10);
            anon_unknown.dwarf_8bad::PrintOptions
                      ((PointCloud *)in_stack_fffffffffffffa10,
                       (Options *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            local_579 = false;
            if (local_168 != (pointer)0x0) {
              VVar5 = draco::Mesh::num_faces((Mesh *)0x111dd9);
              local_579 = VVar5 != 0;
            }
            local_319 = local_579;
            std::unique_ptr<draco::ExpertEncoder,std::default_delete<draco::ExpertEncoder>>::
            unique_ptr<std::default_delete<draco::ExpertEncoder>,void>
                      ((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>
                        *)in_stack_fffffffffffffa10);
            if ((local_319 & 1U) == 0) {
              in_stack_fffffffffffffa70 = operator_new(0xb8);
              std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::operator*
                        ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                         in_stack_fffffffffffffa10);
              draco::ExpertEncoder::ExpertEncoder
                        (in_stack_fffffffffffffa10,
                         (PointCloud *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08)
                        );
              std::unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>::
              reset((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_> *)
                    in_stack_fffffffffffffa10,
                    (pointer)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            }
            else {
              in_stack_fffffffffffffa78 = (ExpertEncoder *)operator_new(0xb8);
              draco::ExpertEncoder::ExpertEncoder
                        (in_stack_fffffffffffffa10,
                         (Mesh *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
              std::unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>::
              reset((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_> *)
                    in_stack_fffffffffffffa10,
                    (pointer)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            }
            std::unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>::
            operator->((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>
                        *)0x111f0d);
            std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::operator*
                      ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                       in_stack_fffffffffffffa10);
            draco::Encoder::CreateExpertEncoderOptions
                      ((Encoder *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
            draco::ExpertEncoder::Reset
                      (in_stack_fffffffffffffa10,
                       (EncoderOptions *)
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
            draco::EncoderOptionsBase<int>::~EncoderOptionsBase
                      ((EncoderOptionsBase<int> *)in_stack_fffffffffffffa10);
            pPVar8 = std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                     operator->((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                                 *)0x111f70);
            this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this,(char *)pPVar8,in_stack_fffffffffffffa40);
            __a = &local_409;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(this,(char *)pPVar8,__a);
            iVar2 = draco::PointCloud::GetAttributeIdByMetadataEntry
                              (in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
            std::__cxx11::string::~string(local_408);
            std::allocator<char>::~allocator(&local_409);
            std::__cxx11::string::~string((string *)(local_3e1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_3e1);
            local_3bc = iVar2;
            if (iVar2 != -1) {
              std::unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>::
              operator->((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>
                          *)0x112049);
              draco::ExpertEncoder::SetAttributePredictionScheme
                        (in_stack_fffffffffffffa78,
                         (int32_t)((ulong)in_stack_fffffffffffffa70 >> 0x20),
                         (int)in_stack_fffffffffffffa70);
              draco::Status::~Status((Status *)0x112074);
            }
            if ((local_319 & 1U) == 0) {
              in_stack_fffffffffffffa20 =
                   std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::
                   operator*((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>
                              *)in_stack_fffffffffffffa10);
              in_stack_fffffffffffffa10 = (ExpertEncoder *)&stack0xffffffffffffffd0;
              std::unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>::get
                        ((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>
                          *)in_stack_fffffffffffffa10);
              local_43c = anon_unknown.dwarf_8bad::EncodePointCloudToFile
                                    ((PointCloud *)
                                     CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                                     in_stack_fffffffffffffab8);
            }
            else {
              std::unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>::get
                        ((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>
                          *)in_stack_fffffffffffffa10);
              local_43c = anon_unknown.dwarf_8bad::EncodeMeshToFile
                                    (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                                     (ExpertEncoder *)
                                     CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
            }
            if ((local_43c != -1) && (local_58 < 10)) {
              printf("For better compression, increase the compression level up to \'-cl 10\' .\n\n"
                    );
            }
            local_4 = local_43c;
            local_90 = 1;
            std::unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>::
            ~unique_ptr((unique_ptr<draco::ExpertEncoder,_std::default_delete<draco::ExpertEncoder>_>
                         *)in_stack_fffffffffffffa20);
            draco::Encoder::~Encoder((Encoder *)0x112223);
          }
        }
        std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::~unique_ptr
                  ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                   in_stack_fffffffffffffa10);
      }
LAB_0011225f:
      anon_unknown.dwarf_8bad::Options::~Options((Options *)in_stack_fffffffffffffa10);
      return local_4;
    }
    iVar2 = strcmp("-h",*(char **)(&local_10->_M_color + (long)local_80 * 2));
    if ((iVar2 == 0) ||
       (iVar2 = strcmp("-?",*(char **)(&local_10->_M_color + (long)local_80 * 2)), iVar2 == 0)) {
      anon_unknown.dwarf_8bad::Usage();
      local_4 = 0;
      local_90 = 1;
      goto LAB_0011225f;
    }
    iVar2 = strcmp("-i",*(char **)(&local_10->_M_color + (long)local_80 * 2));
    if ((iVar2 == 0) && (local_80 < local_7c)) {
      lVar9 = (long)local_80;
      local_80 = local_80 + 1;
      std::__cxx11::string::operator=(local_50,(char *)(&local_10->_M_parent)[lVar9]);
    }
    else {
      iVar2 = strcmp("-o",*(char **)(&local_10->_M_color + (long)local_80 * 2));
      if ((iVar2 == 0) && (local_80 < local_7c)) {
        lVar9 = (long)local_80;
        local_80 = local_80 + 1;
        std::__cxx11::string::operator=
                  ((string *)&stack0xffffffffffffffd0,(char *)(&local_10->_M_parent)[lVar9]);
      }
      else {
        iVar2 = strcmp("-point_cloud",*(char **)(&local_10->_M_color + (long)local_80 * 2));
        if (iVar2 == 0) {
          local_78 = 1;
        }
        else {
          iVar2 = strcmp("-qp",*(char **)(&local_10->_M_color + (long)local_80 * 2));
          if ((iVar2 == 0) && (local_80 < local_7c)) {
            local_80 = local_80 + 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                       in_stack_fffffffffffffa40);
            local_74 = anon_unknown.dwarf_8bad::StringToInt((string *)in_stack_fffffffffffffa10);
            std::__cxx11::string::~string(local_b0);
            std::allocator<char>::~allocator(&local_b1);
            if (0x1e < local_74) {
              printf(
                    "Error: The maximum number of quantization bits for the position attribute is 30.\n"
                    );
              local_4 = -1;
              local_90 = 1;
              goto LAB_0011225f;
            }
          }
          else {
            iVar2 = strcmp("-qt",*(char **)(&local_10->_M_color + (long)local_80 * 2));
            if ((iVar2 == 0) && (local_80 < local_7c)) {
              local_80 = local_80 + 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                         in_stack_fffffffffffffa40);
              local_70 = anon_unknown.dwarf_8bad::StringToInt((string *)in_stack_fffffffffffffa10);
              std::__cxx11::string::~string(local_d8);
              std::allocator<char>::~allocator(&local_d9);
              if (0x1e < local_70) {
                printf(
                      "Error: The maximum number of quantization bits for the texture coordinate attribute is 30.\n"
                      );
                local_4 = -1;
                local_90 = 1;
                goto LAB_0011225f;
              }
            }
            else {
              iVar2 = strcmp("-qn",*(char **)(&local_10->_M_color + (long)local_80 * 2));
              if ((iVar2 == 0) && (local_80 < local_7c)) {
                local_80 = local_80 + 1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                           in_stack_fffffffffffffa40);
                local_68 = anon_unknown.dwarf_8bad::StringToInt((string *)in_stack_fffffffffffffa10)
                ;
                std::__cxx11::string::~string(local_100);
                std::allocator<char>::~allocator(&local_101);
                if (0x1e < local_68) {
                  printf(
                        "Error: The maximum number of quantization bits for the normal attribute is 30.\n"
                        );
                  local_4 = -1;
                  local_90 = 1;
                  goto LAB_0011225f;
                }
              }
              else {
                iVar2 = strcmp("-qg",*(char **)(&local_10->_M_color + (long)local_80 * 2));
                if ((iVar2 == 0) && (local_80 < local_7c)) {
                  local_80 = local_80 + 1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                             in_stack_fffffffffffffa40);
                  local_60 = anon_unknown.dwarf_8bad::StringToInt
                                       ((string *)in_stack_fffffffffffffa10);
                  std::__cxx11::string::~string(local_128);
                  std::allocator<char>::~allocator(&local_129);
                  if (0x1e < local_60) {
                    printf(
                          "Error: The maximum number of quantization bits for generic attributes is 30.\n"
                          );
                    local_4 = -1;
                    local_90 = 1;
                    goto LAB_0011225f;
                  }
                }
                else {
                  iVar2 = strcmp("-cl",*(char **)(&local_10->_M_color + (long)local_80 * 2));
                  if ((iVar2 == 0) && (local_80 < local_7c)) {
                    local_80 = local_80 + 1;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                               in_stack_fffffffffffffa40);
                    local_58 = anon_unknown.dwarf_8bad::StringToInt
                                         ((string *)in_stack_fffffffffffffa10);
                    std::__cxx11::string::~string(local_150);
                    std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0xf));
                  }
                  else {
                    iVar2 = strcmp("--skip",*(char **)(&local_10->_M_color + (long)local_80 * 2));
                    if ((iVar2 == 0) && (local_80 < local_7c)) {
                      iVar2 = strcmp("NORMAL",*(char **)(&local_10->_M_color +
                                                        (long)(local_80 + 1) * 2));
                      if (iVar2 == 0) {
                        local_68 = -1;
                      }
                      else {
                        iVar2 = strcmp("TEX_COORD",
                                       *(char **)(&local_10->_M_color + (long)(local_80 + 1) * 2));
                        if (iVar2 == 0) {
                          local_70 = -1;
                        }
                        else {
                          iVar2 = strcmp("GENERIC",
                                         *(char **)(&local_10->_M_color + (long)(local_80 + 1) * 2))
                          ;
                          if (iVar2 != 0) {
                            printf("Error: Invalid attribute name after --skip\n");
                            local_4 = -1;
                            local_90 = 1;
                            goto LAB_0011225f;
                          }
                          local_60 = -1;
                        }
                      }
                      local_80 = local_80 + 1;
                    }
                    else {
                      iVar2 = strcmp("--metadata",
                                     *(char **)(&local_10->_M_color + (long)local_80 * 2));
                      if (iVar2 == 0) {
                        local_53 = 1;
                      }
                      else {
                        iVar2 = strcmp("-preserve_polygons",
                                       *(char **)(&local_10->_M_color + (long)local_80 * 2));
                        if (iVar2 == 0) {
                          local_54 = 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  Options options;
  const int argc_check = argc - 1;

  for (int i = 1; i < argc; ++i) {
    if (!strcmp("-h", argv[i]) || !strcmp("-?", argv[i])) {
      Usage();
      return 0;
    } else if (!strcmp("-i", argv[i]) && i < argc_check) {
      options.input = argv[++i];
    } else if (!strcmp("-o", argv[i]) && i < argc_check) {
      options.output = argv[++i];
    } else if (!strcmp("-point_cloud", argv[i])) {
      options.is_point_cloud = true;
    } else if (!strcmp("-qp", argv[i]) && i < argc_check) {
      options.pos_quantization_bits = StringToInt(argv[++i]);
      if (options.pos_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the position "
            "attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qt", argv[i]) && i < argc_check) {
      options.tex_coords_quantization_bits = StringToInt(argv[++i]);
      if (options.tex_coords_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the texture "
            "coordinate attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qn", argv[i]) && i < argc_check) {
      options.normals_quantization_bits = StringToInt(argv[++i]);
      if (options.normals_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for the normal "
            "attribute is 30.\n");
        return -1;
      }
    } else if (!strcmp("-qg", argv[i]) && i < argc_check) {
      options.generic_quantization_bits = StringToInt(argv[++i]);
      if (options.generic_quantization_bits > 30) {
        printf(
            "Error: The maximum number of quantization bits for generic "
            "attributes is 30.\n");
        return -1;
      }
    } else if (!strcmp("-cl", argv[i]) && i < argc_check) {
      options.compression_level = StringToInt(argv[++i]);
    } else if (!strcmp("--skip", argv[i]) && i < argc_check) {
      if (!strcmp("NORMAL", argv[i + 1])) {
        options.normals_quantization_bits = -1;
      } else if (!strcmp("TEX_COORD", argv[i + 1])) {
        options.tex_coords_quantization_bits = -1;
      } else if (!strcmp("GENERIC", argv[i + 1])) {
        options.generic_quantization_bits = -1;
      } else {
        printf("Error: Invalid attribute name after --skip\n");
        return -1;
      }
      ++i;
    } else if (!strcmp("--metadata", argv[i])) {
      options.use_metadata = true;
    } else if (!strcmp("-preserve_polygons", argv[i])) {
      options.preserve_polygons = true;
    }
  }
  if (argc < 3 || options.input.empty()) {
    Usage();
    return -1;
  }

  std::unique_ptr<draco::PointCloud> pc;
  draco::Mesh *mesh = nullptr;
  if (!options.is_point_cloud) {
    draco::Options load_options;
    load_options.SetBool("use_metadata", options.use_metadata);
    load_options.SetBool("preserve_polygons", options.preserve_polygons);
    auto maybe_mesh = draco::ReadMeshFromFile(options.input, load_options);
    if (!maybe_mesh.ok()) {
      printf("Failed loading the input mesh: %s.\n",
             maybe_mesh.status().error_msg());
      return -1;
    }
    mesh = maybe_mesh.value().get();
    pc = std::move(maybe_mesh).value();
  } else {
    auto maybe_pc = draco::ReadPointCloudFromFile(options.input);
    if (!maybe_pc.ok()) {
      printf("Failed loading the input point cloud: %s.\n",
             maybe_pc.status().error_msg());
      return -1;
    }
    pc = std::move(maybe_pc).value();
  }

  if (options.pos_quantization_bits < 0) {
    printf("Error: Position attribute cannot be skipped.\n");
    return -1;
  }

  // Delete attributes if needed. This needs to happen before we set any
  // quantization settings.
  if (options.tex_coords_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::TEX_COORD) > 0) {
      options.tex_coords_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::TEX_COORD) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::TEX_COORD, 0));
    }
  }
  if (options.normals_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::NORMAL) > 0) {
      options.normals_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::NORMAL) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::NORMAL, 0));
    }
  }
  if (options.generic_quantization_bits < 0) {
    if (pc->NumNamedAttributes(draco::GeometryAttribute::GENERIC) > 0) {
      options.generic_deleted = true;
    }
    while (pc->NumNamedAttributes(draco::GeometryAttribute::GENERIC) > 0) {
      pc->DeleteAttribute(
          pc->GetNamedAttributeId(draco::GeometryAttribute::GENERIC, 0));
    }
  }
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  // If any attribute has been deleted, run deduplication of point indices again
  // as some points can be possibly combined.
  if (options.tex_coords_deleted || options.normals_deleted ||
      options.generic_deleted) {
    pc->DeduplicatePointIds();
  }
#endif

  // Convert compression level to speed (that 0 = slowest, 10 = fastest).
  const int speed = 10 - options.compression_level;

  draco::Encoder encoder;

  // Setup encoder options.
  if (options.pos_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::POSITION,
                                     options.pos_quantization_bits);
  }
  if (options.tex_coords_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::TEX_COORD,
                                     options.tex_coords_quantization_bits);
  }
  if (options.normals_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::NORMAL,
                                     options.normals_quantization_bits);
  }
  if (options.generic_quantization_bits > 0) {
    encoder.SetAttributeQuantization(draco::GeometryAttribute::GENERIC,
                                     options.generic_quantization_bits);
  }
  encoder.SetSpeedOptions(speed, speed);

  if (options.output.empty()) {
    // Create a default output file by attaching .drc to the input file name.
    options.output = options.input + ".drc";
  }

  PrintOptions(*pc, options);

  const bool input_is_mesh = mesh && mesh->num_faces() > 0;

  // Convert to ExpertEncoder that allows us to set per-attribute options.
  std::unique_ptr<draco::ExpertEncoder> expert_encoder;
  if (input_is_mesh) {
    expert_encoder.reset(new draco::ExpertEncoder(*mesh));
  } else {
    expert_encoder.reset(new draco::ExpertEncoder(*pc));
  }
  expert_encoder->Reset(encoder.CreateExpertEncoderOptions(*pc));

  // Check if there is an attribute that stores polygon edges. If so, we disable
  // the default prediction scheme for the attribute as it actually makes the
  // compression worse.
  const int poly_att_id =
      pc->GetAttributeIdByMetadataEntry("name", "added_edges");
  if (poly_att_id != -1) {
    expert_encoder->SetAttributePredictionScheme(
        poly_att_id, draco::PredictionSchemeMethod::PREDICTION_NONE);
  }

  int ret = -1;

  if (input_is_mesh) {
    ret = EncodeMeshToFile(*mesh, options.output, expert_encoder.get());
  } else {
    ret = EncodePointCloudToFile(*pc, options.output, expert_encoder.get());
  }

  if (ret != -1 && options.compression_level < 10) {
    printf(
        "For better compression, increase the compression level up to '-cl 10' "
        ".\n\n");
  }

  return ret;
}